

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.cpp
# Opt level: O2

void Diligent::ProcessIncludeErrorHandler(ShaderCreateInfo *ShaderCI,string *Error)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  string FileInfo;
  
  FileInfo._M_dataplus._M_p = (pointer)&FileInfo.field_2;
  FileInfo._M_string_length = 0;
  FileInfo.field_2._M_local_buf[0] = '\0';
  if (ShaderCI->FilePath == (Char *)0x0) {
    if ((ShaderCI->Desc).super_DeviceObjectAttribs.Name == (Char *)0x0) goto LAB_0031939d;
    std::__cxx11::string::assign((char *)&FileInfo);
  }
  else {
    std::__cxx11::string::assign((char *)&FileInfo);
  }
  std::__cxx11::string::append((char *)&FileInfo);
  std::__cxx11::string::push_back((char)&FileInfo);
LAB_0031939d:
  this = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)__cxa_allocate_exception(0x40);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (this,&FileInfo,Error);
  __cxa_throw(this,&std::pair<std::__cxx11::string,std::__cxx11::string>::typeinfo,
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair);
}

Assistant:

static void ProcessIncludeErrorHandler(const ShaderCreateInfo& ShaderCI, const std::string& Error) noexcept(false)
{
    std::string FileInfo;
    if (ShaderCI.FilePath != nullptr)
    {
        FileInfo = "file '";
        FileInfo += ShaderCI.FilePath;
        FileInfo += '\'';
    }
    else if (ShaderCI.Desc.Name != nullptr)
    {
        FileInfo = "shader '";
        FileInfo += ShaderCI.Desc.Name;
        FileInfo += '\'';
    }
    throw std::pair<std::string, std::string>{std::move(FileInfo), Error};
}